

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEObserver.cpp
# Opt level: O0

void __thiscall CEObserver::copy_members(CEObserver *this,CEObserver *other)

{
  long in_RSI;
  long in_RDI;
  vector<double,_std::allocator<double>_> *in_stack_00000088;
  vector<double,_std::allocator<double>_> *in_stack_00000090;
  
  *(undefined8 *)(in_RDI + 8) = *(undefined8 *)(in_RSI + 8);
  *(undefined8 *)(in_RDI + 0x10) = *(undefined8 *)(in_RSI + 0x10);
  *(undefined8 *)(in_RDI + 0x18) = *(undefined8 *)(in_RSI + 0x18);
  *(undefined8 *)(in_RDI + 0x20) = *(undefined8 *)(in_RSI + 0x20);
  *(undefined8 *)(in_RDI + 0x28) = *(undefined8 *)(in_RSI + 0x28);
  *(undefined8 *)(in_RDI + 0x38) = *(undefined8 *)(in_RSI + 0x38);
  *(undefined8 *)(in_RDI + 0x30) = *(undefined8 *)(in_RSI + 0x30);
  *(undefined8 *)(in_RDI + 0xa8) = *(undefined8 *)(in_RSI + 0xa8);
  *(undefined8 *)(in_RDI + 0x40) = *(undefined8 *)(in_RSI + 0x40);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  return;
}

Assistant:

void CEObserver::copy_members(const CEObserver& other)
{
    longitude_           = other.longitude_;
    latitude_            = other.latitude_;
    elevation_m_         = other.elevation_m_;
    pressure_hPa_        = other.pressure_hPa_;
    temperature_celsius_ = other.temperature_celsius_;
    wavelength_um_       = other.wavelength_um_;
    relative_humidity_   = other.relative_humidity_;
    utc_offset_          = other.utc_offset_;

    // Copy cached parameters
    cache_date_ = other.cache_date_;
    pos_cirs_   = other.pos_cirs_;
    pos_icrs_   = other.pos_icrs_;
    vel_cirs_   = other.vel_cirs_;
    vel_icrs_   = other.vel_icrs_;
}